

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edits.cpp
# Opt level: O2

int32_t __thiscall
icu_63::Edits::Iterator::sourceIndexFromDestinationIndex
          (Iterator *this,int32_t i,UErrorCode *errorCode)

{
  int32_t iVar1;
  int iVar2;
  int32_t iVar3;
  
  iVar3 = 0;
  iVar1 = findIndex(this,i,'\0',errorCode);
  if (-1 < iVar1) {
    if ((iVar1 == 0) && (iVar2 = i - this->destIndex, iVar2 != 0)) {
      if (this->changed == '\0') {
        iVar3 = this->srcIndex + iVar2;
      }
      else {
        iVar3 = this->srcIndex + this->oldLength_;
      }
    }
    else {
      iVar3 = this->srcIndex;
    }
  }
  return iVar3;
}

Assistant:

int32_t Edits::Iterator::sourceIndexFromDestinationIndex(int32_t i, UErrorCode &errorCode) {
    int32_t where = findIndex(i, FALSE, errorCode);
    if (where < 0) {
        // Error or before the string.
        return 0;
    }
    if (where > 0 || i == destIndex) {
        // At or after string length, or at start of the found span.
        return srcIndex;
    }
    if (changed) {
        // In a change span, map to its end.
        return srcIndex + oldLength_;
    } else {
        // In an unchanged span, offset within it.
        return srcIndex + (i - destIndex);
    }
}